

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall cab_provision_complex6::test_method(cab_provision_complex6 *this)

{
  _Rb_tree_color _Var1;
  cab_manager *this_00;
  shared_ptr<cab> c2;
  shared_ptr<cab> c1;
  shared_ptr<cab_session> session;
  shared_ptr<cab> c;
  __weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> local_160 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_158;
  __weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> local_150 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_148;
  assertion_result local_140;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  local_128;
  const_string local_120;
  char *local_110;
  property_ptr local_108;
  const_string local_100;
  const_string local_f0;
  cab_manager manager;
  lazy_ostream local_38;
  undefined1 *local_28;
  char **local_20;
  
  cab_manager::cab_manager(&manager);
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab_session,void>
            (local_150,&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  cab_manager::create(&manager,(weak_ptr<cab_session> *)local_150);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_148);
  std::__weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab_session,void>
            (local_160,&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  cab_manager::create(&manager,(weak_ptr<cab_session> *)local_160);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_158);
  cab_manager::find_cab((cab_manager *)&c1,(node_type)&manager,P0,8);
  cab::add_request(c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P0,P3,4);
  cab::update_position(c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P0);
  cab::update_position(c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I1);
  cab_manager::find_cab((cab_manager *)&c2,(node_type)&manager,P0,6);
  cab::add_request(c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P0,P2,4);
  cab::update_position(c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I2);
  cab::update_position(c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P2);
  cab::update_position(c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P0);
  cab::update_position(c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I1);
  cab::update_position(c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I2);
  this_00 = (cab_manager *)&c;
  cab_manager::find_cab(this_00,(node_type)&manager,P2,8);
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_f0.m_end = "";
  local_100.m_begin = "";
  local_100.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_f0,0x1cc,&local_100);
  _Var1 = cab::id(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128.m_rhs = cab::id(c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128.m_lhs.m_value = _Var1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  ::evaluate(&local_140,&local_128,false);
  local_20 = &local_110;
  local_110 = "c->id() == c2->id()";
  local_108.px = (no_property *)0x16ded7;
  local_38.m_empty = false;
  local_38._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_28 = boost::unit_test::lazy_ostream::inst;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_120.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_140,&local_38,&local_120,0x1cc,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab_manager::~cab_manager(&manager);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_complex6)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;
    
    manager.create(session);
    manager.create(session);

    node_type src = node_type::P0;
    node_type dst = node_type::P3;

    std::shared_ptr<cab> c1 = manager.find_cab(src, dst, 4);
    c1->add_request(src, dst, 4);

    c1->update_position(node_type::P0);
    c1->update_position(node_type::I1);

    src = node_type::P0;
    dst = node_type::P2;
    std::shared_ptr<cab> c2 = manager.find_cab(src, dst, 4);
    c2->add_request(src, dst, 4);

    c1->update_position(node_type::I2);
    c1->update_position(node_type::P2);

    c2->update_position(node_type::P0);
    c2->update_position(node_type::I1);
    c2->update_position(node_type::I2); 

    src = node_type::P2;
    dst = node_type::P3;
    std::shared_ptr<cab> c = manager.find_cab(src, dst, 1);

    BOOST_TEST(c->id() == c2->id());
}